

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

AsmJsScriptFunction *
Js::AsmJsScriptFunction::OP_NewAsmJsFunc(FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  FunctionProxy *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  AsmJsScriptFunction *pAVar5;
  
  if (infoRef == (FunctionInfoPtrPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x24c,"(infoRef != nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) goto LAB_00be8a15;
    *puVar3 = 0;
  }
  this = (infoRef->ptr->functionBodyImpl).ptr;
  if (this == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x24e,"(functionProxy != nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) goto LAB_00be8a15;
    *puVar3 = 0;
  }
  pSVar4 = FunctionProxy::GetScriptContext(this);
  bVar2 = FunctionProxy::HasSuperReference(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x252,"(!functionProxy->HasSuperReference())",
                                "!functionProxy->HasSuperReference()");
    if (!bVar2) {
LAB_00be8a15:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pAVar5 = JavascriptLibrary::CreateAsmJsScriptFunction
                     ((pSVar4->super_ScriptContextBase).javascriptLibrary,this);
  Memory::WriteBarrierPtr<Js::FrameDisplay>::WriteBarrierSet
            (&(pAVar5->super_ScriptFunction).environment,environment);
  return pAVar5;
}

Assistant:

AsmJsScriptFunction * AsmJsScriptFunction::OP_NewAsmJsFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        AssertMsg(infoRef != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        AssertMsg(functionProxy != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");

        ScriptContext* scriptContext = functionProxy->GetScriptContext();

        Assert(!functionProxy->HasSuperReference());
        AsmJsScriptFunction* asmJsFunc = scriptContext->GetLibrary()->CreateAsmJsScriptFunction(functionProxy);
        asmJsFunc->SetEnvironment(environment);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(asmJsFunc, EtwTrace::GetFunctionId(functionProxy)));

        return asmJsFunc;
    }